

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O2

void __thiscall
MarkerIndex::Iterator::find_ending_in(Iterator *this,Point *start,Point *end,MarkerIdSet *result)

{
  bool bVar1;
  
  reset(this);
  if (this->current_node != (Node *)0x0) {
    seek_to_first_node_greater_than_or_equal_to(this,start);
    while (this->current_node != (Node *)0x0) {
      bVar1 = Point::operator<=(&this->current_node_position,end);
      if (!bVar1) {
        return;
      }
      flat_set<unsigned_int>::insert
                (result,(const_iterator)
                        (this->current_node->end_marker_ids).contents.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                 (const_iterator)
                 (this->current_node->end_marker_ids).contents.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      cache_node_position(this);
      move_to_successor(this);
    }
  }
  return;
}

Assistant:

void MarkerIndex::Iterator::find_ending_in(const Point &start, const Point &end, MarkerIdSet *result) {
  reset();

  if (!current_node) return;

  seek_to_first_node_greater_than_or_equal_to(start);

  while (current_node && current_node_position <= end) {
    result->insert(current_node->end_marker_ids.begin(), current_node->end_marker_ids.end());
    cache_node_position();
    move_to_successor();
  }
}